

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O0

void keccak_accumulate(keccak_state *s,void *vdata,size_t len)

{
  size_t __n;
  uint64_t uVar1;
  uint local_40;
  uint local_3c;
  uint x;
  uint y;
  size_t n;
  size_t b;
  uchar *data;
  size_t len_local;
  void *vdata_local;
  keccak_state *s_local;
  
  b = (size_t)vdata;
  data = (uchar *)len;
  while ((uchar *)(s->bytes_wanted - s->bytes_got) <= data) {
    __n = s->bytes_wanted - s->bytes_got;
    memcpy(s->bytes + s->bytes_got,(void *)b,__n);
    data = data + -__n;
    b = __n + b;
    _x = 0;
    for (local_3c = 0; local_3c < 5; local_3c = local_3c + 1) {
      local_40 = 0;
      for (; (local_40 < 5 && (_x < s->bytes_wanted)); _x = _x + 8) {
        uVar1 = GET_64BIT_LSB_FIRST(s->bytes + _x);
        s->A[local_40][local_3c] = uVar1 ^ s->A[local_40][local_3c];
        local_40 = local_40 + 1;
      }
    }
    keccak_transform((uint64_t (*) [5])s);
    s->bytes_got = 0;
  }
  memcpy(s->bytes + s->bytes_got,(void *)b,(size_t)data);
  s->bytes_got = (size_t)(data + s->bytes_got);
  return;
}

Assistant:

static void keccak_accumulate(keccak_state *s, const void *vdata, size_t len)
{
    const unsigned char *data = (const unsigned char *)vdata;

    while (len >= s->bytes_wanted - s->bytes_got) {
        size_t b = s->bytes_wanted - s->bytes_got;
        memcpy(s->bytes + s->bytes_got, data, b);
        len -= b;
        data += b;

        size_t n = 0;
        for (unsigned y = 0; y < 5; y++) {
            for (unsigned x = 0; x < 5; x++) {
                if (n >= s->bytes_wanted)
                    break;

                s->A[x][y] ^= GET_64BIT_LSB_FIRST(s->bytes + n);
                n += 8;
            }
        }
        keccak_transform(s->A);

        s->bytes_got = 0;
    }

    memcpy(s->bytes + s->bytes_got, data, len);
    s->bytes_got += len;
}